

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O0

void luaV_settable(lua_State *L,TValue *t,TValue *key,StkId val)

{
  uint uVar1;
  GCObject *o;
  Table *local_68;
  Table *local_60;
  TValue *io1;
  TValue *io2;
  TValue *oldval;
  Table *h;
  TValue *tm;
  int loop;
  StkId val_local;
  TValue *key_local;
  TValue *t_local;
  lua_State *L_local;
  
  tm._4_4_ = 0;
  key_local = t;
  do {
    if (99 < tm._4_4_) {
      luaG_runerror(L,"loop in settable");
    }
    if (key_local->tt_ == 0x45) {
      o = (GCObject *)(key_local->value_).f;
      io2 = luaH_get(&o->h,key);
      if (io2->tt_ != 0) {
LAB_0011b499:
        io2->value_ = val->value_;
        io2->tt_ = val->tt_;
        (o->h).flags = '\0';
        if ((((val->tt_ & 0x40U) != 0) && (((byte)(val->value_).f[9] & 3) != 0)) &&
           (((o->gch).marked & 4) != 0)) {
          luaC_barrierback_(L,o);
        }
        return;
      }
      if ((o->h).metatable == (Table *)0x0) {
        local_60 = (Table *)0x0;
      }
      else {
        if ((((o->h).metatable)->flags & 2) == 0) {
          local_68 = (Table *)luaT_gettm((o->h).metatable,TM_NEWINDEX,L->l_G->tmname[1]);
        }
        else {
          local_68 = (Table *)0x0;
        }
        local_60 = local_68;
      }
      h = local_60;
      if (local_60 == (Table *)0x0) {
        if (io2 == &luaO_nilobject_) {
          io2 = luaH_newkey(L,&o->h,key);
        }
        goto LAB_0011b499;
      }
    }
    else {
      h = (Table *)luaT_gettmbyobj(L,key_local,TM_NEWINDEX);
      if (*(int *)&h->tt == 0) {
        luaG_typeerror(L,key_local,"index");
      }
    }
    uVar1._0_1_ = h->tt;
    uVar1._1_1_ = h->marked;
    uVar1._2_1_ = h->flags;
    uVar1._3_1_ = h->lsizenode;
    if ((uVar1 & 0xf) == 6) {
      callTM(L,(TValue *)h,key_local,key,val,0);
      return;
    }
    key_local = (TValue *)h;
    tm._4_4_ = tm._4_4_ + 1;
  } while( true );
}

Assistant:

void luaV_settable (lua_State *L, const TValue *t, TValue *key, StkId val) {
  int loop;
  for (loop = 0; loop < MAXTAGLOOP; loop++) {
    const TValue *tm;
    if (ttistable(t)) {  /* `t' is a table? */
      Table *h = hvalue(t);
      TValue *oldval = cast(TValue *, luaH_get(h, key));
      /* if previous value is not nil, there must be a previous entry
         in the table; moreover, a metamethod has no relevance */
      if (!ttisnil(oldval) ||
         /* previous value is nil; must check the metamethod */
         ((tm = fasttm(L, h->metatable, TM_NEWINDEX)) == NULL &&
         /* no metamethod; is there a previous entry in the table? */
         (oldval != luaO_nilobject ||
         /* no previous entry; must create one. (The next test is
            always true; we only need the assignment.) */
         (oldval = luaH_newkey(L, h, key), 1)))) {
        /* no metamethod and (now) there is an entry with given key */
        setobj2t(L, oldval, val);  /* assign new value to that entry */
        invalidateTMcache(h);
        luaC_barrierback(L, obj2gco(h), val);
        return;
      }
      /* else will try the metamethod */
    }
    else  /* not a table; check metamethod */
      if (ttisnil(tm = luaT_gettmbyobj(L, t, TM_NEWINDEX)))
        luaG_typeerror(L, t, "index");
    /* there is a metamethod */
    if (ttisfunction(tm)) {
      callTM(L, tm, t, key, val, 0);
      return;
    }
    t = tm;  /* else repeat with 'tm' */
  }
  luaG_runerror(L, "loop in settable");
}